

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getCurTime(time_point start_time,string *msg)

{
  ostream *poVar1;
  rep rVar2;
  string *in_RSI;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> duration;
  time_point cur;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffc8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffd0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffd8;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  undefined8 local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = std::chrono::_V2::steady_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffffc8);
  poVar1 = std::operator<<((ostream *)&std::cout,local_10);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Time: ");
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," msec\n");
  return;
}

Assistant:

void getCurTime(decltype(chrono::steady_clock::now()) start_time, string && msg) {
    auto cur = chrono::steady_clock::now();
    auto duration = std::chrono::duration_cast<std::chrono::milliseconds>(cur - start_time);
    cout << msg << endl;
    std::cout << "Time: " << duration.count() << " msec\n";
}